

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_st(DisasContext_conflict6 *ctx,uint32_t opc,int rt,int base,int offset)

{
  TCGContext_conflict6 *s;
  uintptr_t o_3;
  TCGTemp *pTVar1;
  TCGv_i32 pTVar2;
  TCGArg idx;
  int32_t val;
  code *func;
  MemOp_conflict2 memop;
  uintptr_t o_1;
  TCGv_i64 addr;
  uintptr_t o_2;
  TCGv_i64 val_00;
  TCGTemp *local_58;
  TCGv_i64 local_50;
  TCGv_i64 local_48;
  TCGTemp *local_40;
  
  s = ctx->uc->tcg_ctx;
  pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  addr = (TCGv_i64)((long)pTVar1 - (long)s);
  pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  val_00 = (TCGv_i64)((long)pTVar1 - (long)s);
  val = ctx->mem_idx;
  gen_base_offset_addr(ctx,addr,base,offset);
  if (rt == 0) {
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar1,0);
  }
  else if (s->cpu_gpr[rt] != val_00) {
    tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar1,(TCGArg)(s->cpu_gpr[rt] + (long)s));
  }
  if ((int)opc < -0x48000000) {
    if (-0x54000001 < (int)opc) {
      if (opc != 0xac000000) {
        if (opc == 0xb0000000) {
          pTVar2 = tcg_const_i32_mips64el(s,val);
          local_58 = (TCGTemp *)(s->cpu_env + (long)s);
          local_40 = (TCGTemp *)(pTVar2 + (long)s);
          func = helper_sdl_mips64el;
        }
        else {
          if (opc != 0xb4000000) goto switchD_00995828_caseD_7c00001e;
          pTVar2 = tcg_const_i32_mips64el(s,val);
          local_58 = (TCGTemp *)(s->cpu_env + (long)s);
          local_40 = (TCGTemp *)(pTVar2 + (long)s);
          func = helper_sdr_mips64el;
        }
        goto LAB_00995a3d;
      }
      goto LAB_00995981;
    }
    if (opc != 0xa0000000) {
      if (opc != 0xa4000000) {
        if (opc != 0xa8000000) goto switchD_00995828_caseD_7c00001e;
        goto LAB_00995928;
      }
      goto LAB_00995998;
    }
LAB_0099596b:
    idx = (TCGArg)val;
    memop = MO_8;
    goto LAB_009959b1;
  }
  switch(opc) {
  case 0x7c00001c:
    val = 2;
    goto LAB_0099596b;
  case 0x7c00001d:
    val = 2;
LAB_00995998:
    idx = (TCGArg)val;
    memop = ctx->default_tcg_memop_mask | MO_16;
    break;
  case 0x7c00001e:
  case 0x7c000020:
    goto switchD_00995828_caseD_7c00001e;
  case 0x7c00001f:
    val = 2;
LAB_00995981:
    idx = (TCGArg)val;
    memop = ctx->default_tcg_memop_mask | MO_32;
    break;
  case 0x7c000021:
    val = 2;
LAB_00995928:
    pTVar2 = tcg_const_i32_mips64el(s,val);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    local_40 = (TCGTemp *)(pTVar2 + (long)s);
    func = helper_swl_mips64el;
    goto LAB_00995a3d;
  case 0x7c000022:
    val = 2;
LAB_00995a04:
    pTVar2 = tcg_const_i32_mips64el(s,val);
    local_58 = (TCGTemp *)(s->cpu_env + (long)s);
    local_40 = (TCGTemp *)(pTVar2 + (long)s);
    func = helper_swr_mips64el;
LAB_00995a3d:
    pTVar1 = local_40;
    local_48 = (TCGv_i64)((long)s + (long)addr);
    local_50 = (TCGv_i64)((long)s + (long)val_00);
    tcg_gen_callN_mips64el(s,func,(TCGTemp *)0x0,4,&local_58);
    tcg_temp_free_internal_mips64el(s,pTVar1);
    goto switchD_00995828_caseD_7c00001e;
  default:
    if (opc == 0xb8000000) goto LAB_00995a04;
    if (opc != 0xfc000000) goto switchD_00995828_caseD_7c00001e;
    idx = (TCGArg)val;
    memop = ctx->default_tcg_memop_mask | MO_64;
  }
LAB_009959b1:
  tcg_gen_qemu_st_i64_mips64el(s,val_00,addr,idx,memop);
switchD_00995828_caseD_7c00001e:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(addr + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(val_00 + (long)s));
  return;
}

Assistant:

static void gen_st(DisasContext *ctx, uint32_t opc, int rt,
                   int base, int offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    int mem_idx = ctx->mem_idx;

    gen_base_offset_addr(ctx, t0, base, offset);
    gen_load_gpr(tcg_ctx, t1, rt);
    switch (opc) {
#if defined(TARGET_MIPS64)
    case OPC_SD:
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, mem_idx, MO_TEQ |
                           ctx->default_tcg_memop_mask);
        break;
    case OPC_SDL:
        gen_helper_0e2i(sdl, t1, t0, mem_idx);
        break;
    case OPC_SDR:
        gen_helper_0e2i(sdr, t1, t0, mem_idx);
        break;
#endif
    case OPC_SWE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_SW:
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, mem_idx, MO_TEUL |
                           ctx->default_tcg_memop_mask);
        break;
    case OPC_SHE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_SH:
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, mem_idx, MO_TEUW |
                           ctx->default_tcg_memop_mask);
        break;
    case OPC_SBE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_SB:
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, mem_idx, MO_8);
        break;
    case OPC_SWLE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_SWL:
        gen_helper_0e2i(swl, t1, t0, mem_idx);
        break;
    case OPC_SWRE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_SWR:
        gen_helper_0e2i(swr, t1, t0, mem_idx);
        break;
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}